

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.h
# Opt level: O0

Ptr __thiscall hwnet::TCPSocket::Start(TCPSocket *this)

{
  Poller *this_00;
  bool bVar1;
  long in_RSI;
  shared_ptr<hwnet::TCPSocket> sVar2;
  Ptr PVar3;
  enable_shared_from_this<hwnet::TCPSocket> local_40;
  shared_ptr<hwnet::Channel> local_30;
  bool local_19 [8];
  bool expected;
  TCPSocket *this_local;
  
  local_19[0] = false;
  this_local = this;
  bVar1 = std::atomic<bool>::compare_exchange_strong
                    ((atomic<bool> *)(in_RSI + 0xa78),local_19,true,memory_order_seq_cst);
  if (bVar1) {
    this_00 = *(Poller **)(in_RSI + 0x930);
    std::enable_shared_from_this<hwnet::TCPSocket>::shared_from_this(&local_40);
    std::shared_ptr<hwnet::Channel>::shared_ptr<hwnet::TCPSocket,void>
              (&local_30,(shared_ptr<hwnet::TCPSocket> *)&local_40);
    Poller::Add(this_00,&local_30,0xe);
    std::shared_ptr<hwnet::Channel>::~shared_ptr(&local_30);
    std::shared_ptr<hwnet::TCPSocket>::~shared_ptr((shared_ptr<hwnet::TCPSocket> *)&local_40);
  }
  sVar2 = std::enable_shared_from_this<hwnet::TCPSocket>::shared_from_this
                    ((enable_shared_from_this<hwnet::TCPSocket> *)this);
  PVar3.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
       sVar2.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  PVar3.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr)PVar3.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TCPSocket::Ptr Start() {
		bool expected = false;
		if(this->started.compare_exchange_strong(expected,true)) {
			this->poller_->Add(shared_from_this(),Poller::Read | Poller::Write | Poller::ET);
			//this->poller_->Add(shared_from_this(),Poller::Read | Poller::ET);
		}
		return shared_from_this();
	}